

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Cloud.h
# Opt level: O1

uint __thiscall Nova::Point_Cloud<double,_3>::Add_Vertex(Point_Cloud<double,_3> *this,TV *X)

{
  pointer *ppVVar1;
  iterator __position;
  double dVar2;
  
  __position._M_current =
       (this->points)._data.
       super__Vector_base<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->points)._data.
      super__Vector_base<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Nova::Vector<double,3,true>,std::allocator<Nova::Vector<double,3,true>>>::
    _M_realloc_insert<Nova::Vector<double,3,true>const&>
              ((vector<Nova::Vector<double,3,true>,std::allocator<Nova::Vector<double,3,true>>> *)
               this,__position,X);
  }
  else {
    ((__position._M_current)->_data)._M_elems[2] = (X->_data)._M_elems[2];
    dVar2 = (X->_data)._M_elems[1];
    ((__position._M_current)->_data)._M_elems[0] = (X->_data)._M_elems[0];
    ((__position._M_current)->_data)._M_elems[1] = dVar2;
    ppVVar1 = &(this->points)._data.
               super__Vector_base<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return (int)((ulong)((long)(this->points)._data.
                             super__Vector_base<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->points)._data.
                            super__Vector_base<Nova::Vector<double,_3,_true>,_std::allocator<Nova::Vector<double,_3,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
}

Assistant:

unsigned Add_Vertex(const TV& X)
    {
        points.Append(X);
        return points.size();
    }